

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O2

void __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::set_bitset_table
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,range_pairs *fcc)

{
  ulong *puVar1;
  pointer prVar2;
  uchar21 uVar3;
  size_type i;
  ulong uVar4;
  uchar21 cp;
  bool bVar5;
  
  uVar4 = 0;
  do {
    if ((fcc->rparray_).size_ <= uVar4) {
      return;
    }
    prVar2 = (fcc->rparray_).buffer_;
    cp = prVar2[uVar4].first;
    do {
      if (0x10ffff < (uint)cp) break;
      uVar3 = utf8_traits<char>::firstcodeunit(cp);
      puVar1 = (ulong *)((long)(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).
                               firstchar_class_bs.buffer_ + (ulong)((uint)uVar3 >> 3 & 0x18));
      *puVar1 = *puVar1 | (long)(1 << ((byte)uVar3 & 0x1f));
      bVar5 = cp != prVar2[uVar4].second;
      cp = cp + L'\x01';
    } while (bVar5);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void set_bitset_table(const range_pairs &fcc)
	{
		for (typename range_pairs::size_type i = 0; i < fcc.size(); ++i)
		{
			const range_pair &range = fcc[i];

			for (uchar21 ucp = range.first; ucp <= constants::unicode_max_codepoint; ++ucp)
			{
				this->firstchar_class_bs.set(utf_traits::firstcodeunit(ucp) & utf_traits::bitsetmask);

				if (ucp == range.second)
					break;
			}
		}
	}